

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HLSLBindingFlags hlsl_resource_type_to_flag(string *arg)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  string *arg_local;
  
  bVar1 = std::operator==(arg,"push");
  if (bVar1) {
    arg_local._4_4_ = 1;
  }
  else {
    bVar1 = std::operator==(arg,"cbv");
    if (bVar1) {
      arg_local._4_4_ = 2;
    }
    else {
      bVar1 = std::operator==(arg,"srv");
      if (bVar1) {
        arg_local._4_4_ = 4;
      }
      else {
        bVar1 = std::operator==(arg,"uav");
        if (bVar1) {
          arg_local._4_4_ = 8;
        }
        else {
          bVar1 = std::operator==(arg,"sampler");
          if (bVar1) {
            arg_local._4_4_ = 0x10;
          }
          else {
            bVar1 = std::operator==(arg,"all");
            __stream = _stderr;
            if (bVar1) {
              arg_local._4_4_ = 0x7fffffff;
            }
            else {
              uVar2 = std::__cxx11::string::c_str();
              fprintf(__stream,"Invalid resource type for --hlsl-auto-binding: %s\n",uVar2);
              arg_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return arg_local._4_4_;
}

Assistant:

static HLSLBindingFlags hlsl_resource_type_to_flag(const std::string &arg)
{
	if (arg == "push")
		return HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
	else if (arg == "cbv")
		return HLSL_BINDING_AUTO_CBV_BIT;
	else if (arg == "srv")
		return HLSL_BINDING_AUTO_SRV_BIT;
	else if (arg == "uav")
		return HLSL_BINDING_AUTO_UAV_BIT;
	else if (arg == "sampler")
		return HLSL_BINDING_AUTO_SAMPLER_BIT;
	else if (arg == "all")
		return HLSL_BINDING_AUTO_ALL;
	else
	{
		fprintf(stderr, "Invalid resource type for --hlsl-auto-binding: %s\n", arg.c_str());
		return 0;
	}
}